

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O0

int * Vga_ManLookup(Vta_Man_t *p,int iObj,int iFrame)

{
  int iVar1;
  int *local_28;
  int *pPlace;
  Vta_Obj_t *pThis;
  int iFrame_local;
  int iObj_local;
  Vta_Man_t *p_local;
  
  local_28 = p->pBins;
  iVar1 = Vga_ManHash(iObj,iFrame,p->nBins);
  local_28 = local_28 + iVar1;
  pPlace = &Vta_ManObj(p,*local_28)->iObj;
  while ((pPlace != (int *)0x0 && ((*pPlace != iObj || (pPlace[1] != iFrame))))) {
    local_28 = pPlace + 2;
    pPlace = &Vta_ManObj(p,*local_28)->iObj;
  }
  return local_28;
}

Assistant:

static inline int * Vga_ManLookup( Vta_Man_t * p, int iObj, int iFrame )
{
    Vta_Obj_t * pThis;
    int * pPlace = p->pBins + Vga_ManHash( iObj, iFrame, p->nBins );
    for ( pThis = Vta_ManObj(p, *pPlace); 
          pThis;  pPlace = &pThis->iNext, 
          pThis = Vta_ManObj(p, *pPlace) )
        if ( pThis->iObj == iObj && pThis->iFrame == iFrame )
            break;
    return pPlace;
}